

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

string * cfgfile::generator::generate_class_name(string *__return_storage_ptr__,string *name)

{
  long lVar1;
  string asStack_38 [32];
  
  lVar1 = std::__cxx11::string::rfind((string *)name,0x137848);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)name);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (lVar1 == -1) {
    std::__cxx11::string::string(asStack_38,(string *)name);
  }
  else {
    std::__cxx11::string::substr((ulong)asStack_38,(ulong)name);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string(asStack_38);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string generate_class_name( const std::string & name )
{
	const auto pos = name.rfind( cfg::c_namespace_separator );

	std::string res = ( pos == std::string::npos ? std::string() :
		name.substr( 0, pos + cfg::c_namespace_separator.length() ) );
	res.append( "tag_" );
	res.append( ( pos == std::string::npos ? name :
		name.substr( pos + cfg::c_namespace_separator.length() ) ) );

	return res;
}